

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv_listen(uv_stream_t *stream,int backlog,uv_connection_cb cb)

{
  int local_24;
  int err;
  uv_connection_cb cb_local;
  int backlog_local;
  uv_stream_t *stream_local;
  
  if (stream->type == UV_NAMED_PIPE) {
    local_24 = uv_pipe_listen((uv_pipe_t *)stream,backlog,cb);
  }
  else if (stream->type == UV_TCP) {
    local_24 = uv_tcp_listen((uv_tcp_t *)stream,backlog,cb);
  }
  else {
    local_24 = -0x16;
  }
  if (((local_24 == 0) && ((stream->flags & 4) == 0)) &&
     (stream->flags = stream->flags | 4, (stream->flags & 8) != 0)) {
    stream->loop->active_handles = stream->loop->active_handles + 1;
  }
  return local_24;
}

Assistant:

int uv_listen(uv_stream_t* stream, int backlog, uv_connection_cb cb) {
  int err;

  switch (stream->type) {
  case UV_TCP:
    err = uv_tcp_listen((uv_tcp_t*)stream, backlog, cb);
    break;

  case UV_NAMED_PIPE:
    err = uv_pipe_listen((uv_pipe_t*)stream, backlog, cb);
    break;

  default:
    err = UV_EINVAL;
  }

  if (err == 0)
    uv__handle_start(stream);

  return err;
}